

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fstack.cpp
# Opt level: O3

bool fstk_FindFile(char *path,char **fullPath,size_t *size)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  int *piVar5;
  bool bVar6;
  ulong uVar7;
  char *pcVar8;
  stat statbuf;
  stat local_c0;
  
  if (*size == 0) {
    *size = 0x40;
    pcVar8 = (char *)realloc(*fullPath,0x40);
    *fullPath = pcVar8;
    if (pcVar8 == (char *)0x0) {
      piVar5 = __errno_location();
      pcVar8 = strerror(*piVar5);
      error("realloc error during include path search: %s\n",pcVar8);
      goto LAB_0010ba2a;
    }
  }
  else {
LAB_0010ba2a:
    if (*fullPath == (char *)0x0) goto LAB_0010bb62;
  }
  uVar7 = 0xffffffffffffffff;
  do {
    pcVar8 = "";
    if (uVar7 != 0xffffffffffffffff) {
      pcVar8 = includePaths[uVar7];
    }
    uVar2 = snprintf(*fullPath,*size,"%s%s",pcVar8,path);
    if ((int)uVar2 < 0) {
      pcVar8 = "snprintf error during include path search: %s\n";
LAB_0010bb49:
      piVar5 = __errno_location();
      pcVar4 = strerror(*piVar5);
      error(pcVar8,pcVar4);
      break;
    }
    if (*size <= (ulong)uVar2) {
      *size = (ulong)(uVar2 + 1);
      pcVar4 = (char *)realloc(*fullPath,(ulong)(uVar2 + 1));
      *fullPath = pcVar4;
      if (pcVar4 == (char *)0x0) {
        pcVar8 = "realloc error during include path search: %s\n";
      }
      else {
        iVar3 = sprintf(pcVar4,"%s%s",pcVar8,path);
        if (-1 < iVar3) goto LAB_0010bacf;
        pcVar8 = "sprintf error during include path search: %s\n";
      }
      goto LAB_0010bb49;
    }
LAB_0010bacf:
    iVar3 = stat(*fullPath,&local_c0);
    if ((iVar3 == 0) && ((local_c0.st_mode & 0xf000) != 0x4000)) {
      path = *fullPath;
      bVar1 = true;
      goto LAB_0010bb7b;
    }
    uVar7 = uVar7 + 1;
  } while (uVar7 < nbIncPaths);
LAB_0010bb62:
  piVar5 = __errno_location();
  *piVar5 = 2;
  bVar6 = false;
  bVar1 = false;
  if (generatedMissingIncludes == true) {
LAB_0010bb7b:
    bVar6 = bVar1;
    printDep(path);
  }
  return bVar6;
}

Assistant:

bool fstk_FindFile(char const *path, char **fullPath, size_t *size)
{
	if (!*size) {
		*size = 64; // This is arbitrary, really
		*fullPath = (char *)realloc(*fullPath, *size);
		if (!*fullPath)
			error("realloc error during include path search: %s\n",
			      strerror(errno));
	}

	if (*fullPath) {
		for (size_t i = 0; i <= nbIncPaths; ++i) {
			char const *incPath = i ? includePaths[i - 1] : "";
			int len = snprintf(*fullPath, *size, "%s%s", incPath, path);

			if (len < 0) {
				error("snprintf error during include path search: %s\n",
				      strerror(errno));
				break;
			}

			// Oh how I wish `asnprintf` was standard...
			if ((size_t)len >= *size) { // `size` includes the terminator, `len` doesn't
				*size = len + 1;
				*fullPath = (char *)realloc(*fullPath, *size);
				if (!*fullPath) {
					error("realloc error during include path search: %s\n",
					      strerror(errno));
					break;
				}
				len = sprintf(*fullPath, "%s%s", incPath, path);
				if (len < 0) {
					error("sprintf error during include path search: %s\n",
					       strerror(errno));
					break;
				}
			}

			if (isPathValid(*fullPath)) {
				printDep(*fullPath);
				return true;
			}
		}
	}

	errno = ENOENT;
	if (generatedMissingIncludes)
		printDep(path);
	return false;
}